

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_191e68f::MonochromeRealtimeTest_TestMonochromeEncoding_Test::TestBody
          (MonochromeRealtimeTest_TestMonochromeEncoding_Test *this)

{
  EncoderTest *pEVar1;
  undefined8 *puVar2;
  bool bVar3;
  pointer *__ptr;
  SEARCH_METHODS *message;
  pointer lhs;
  AssertHelper local_c8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int initial_chroma_value;
  AssertHelper local_98;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,0x1e);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.init_flags_ = 0x10000;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.monochrome = 1;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_target_bitrate
       = 0x28;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_buf_sz = 6000;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_buf_initial_sz
       = 4000;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_buf_optimal_sz
       = 5000;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      lhs = (this->super_MonochromeRealtimeTest).super_MonochromeTest.chroma_value_list_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
      initial_chroma_value = *lhs;
      if (lhs != (this->super_MonochromeRealtimeTest).super_MonochromeTest.chroma_value_list_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish) {
        do {
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_fatal_failure_checker,"*iter","initial_chroma_value",lhs,
                     &initial_chroma_value);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            message = "";
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
              message = *(SEARCH_METHODS **)
                         CONCAT71(gtest_fatal_failure_checker._9_7_,
                                  gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/monochrome_test.cc"
                       ,0xcd,(char *)message);
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
          }
          puVar2 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          lhs = lhs + 1;
        } while (lhs != (this->super_MonochromeRealtimeTest).super_MonochromeTest.chroma_value_list_
                        .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      goto LAB_006618f4;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/monochrome_test.cc"
             ,0xc5,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_006618f4:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(MonochromeRealtimeTest, TestMonochromeEncoding) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 30);
  init_flags_ = AOM_CODEC_USE_PSNR;
  // Set monochrome encoding flag
  cfg_.monochrome = 1;
  // Run at low bitrate.
  cfg_.rc_target_bitrate = 40;
  cfg_.rc_buf_sz = 6000;
  cfg_.rc_buf_initial_sz = 4000;
  cfg_.rc_buf_optimal_sz = 5000;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check that the chroma planes are equal across all frames
  std::vector<int>::const_iterator iter = chroma_value_list_.begin();
  int initial_chroma_value = *iter;
  for (; iter != chroma_value_list_.end(); ++iter) {
    // Check that all decoded frames have the same constant chroma planes.
    EXPECT_EQ(*iter, initial_chroma_value);
  }
#endif
}